

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOBindingRenderCase::generateShaders
          (SSBOBindingRenderCase *this)

{
  int iVar1;
  ShaderType SVar2;
  ostream *poVar3;
  const_reference pvVar4;
  ShaderProgram *this_00;
  RenderContext *renderCtx;
  ProgramSources *pPVar5;
  char *pcVar6;
  char *local_6e8;
  GLint local_630;
  bool local_629;
  string local_618;
  string local_5f8;
  string local_5d8;
  ShaderSource local_5b8;
  string local_590;
  string local_570;
  string local_550;
  ShaderSource local_530;
  ProgramSources local_508;
  string local_438;
  byte local_413;
  byte local_412;
  allocator<char> local_411;
  string local_410;
  byte local_3eb;
  byte local_3ea;
  allocator<char> local_3e9;
  string local_3e8;
  undefined1 local_3c8 [8];
  string uname;
  int bindNdx;
  byte local_37b;
  byte local_37a;
  allocator<char> local_379;
  string local_378;
  string local_358;
  string local_338;
  int local_318;
  GLint local_314;
  int declNdx;
  int numDeclarations;
  bool arrayInstance;
  ostringstream local_300 [8];
  ostringstream shaderBody;
  ostringstream local_188 [8];
  ostringstream shaderUniformDecl;
  SSBOBindingRenderCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__cxx11::ostringstream::ostringstream(local_300);
  local_629 = true;
  if ((this->super_LayoutBindingRenderCase).m_testType != TESTTYPE_BINDING_ARRAY) {
    local_629 = (this->super_LayoutBindingRenderCase).m_testType == TESTTYPE_BINDING_MAX_ARRAY;
  }
  declNdx._3_1_ = local_629;
  if (local_629 == false) {
    local_630 = (this->super_LayoutBindingRenderCase).m_numBindings;
  }
  else {
    local_630 = 1;
  }
  local_314 = local_630;
  for (local_318 = 0; local_318 < local_314; local_318 = local_318 + 1) {
    poVar3 = std::operator<<((ostream *)local_188,"layout(std140, binding = ");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(this->super_LayoutBindingRenderCase).m_bindings,(long)local_318);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
    poVar3 = std::operator<<(poVar3,") buffer ");
    getUniformName(&local_338,&(this->super_LayoutBindingRenderCase).m_uniformName,local_318);
    poVar3 = std::operator<<(poVar3,(string *)&local_338);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color1;\n");
    poVar3 = std::operator<<(poVar3,"\thighp vec4 color2;\n");
    poVar3 = std::operator<<(poVar3,"} ");
    local_37a = 0;
    local_37b = 0;
    uname.field_2._M_local_buf[0xe] = '\0';
    uname.field_2._M_local_buf[0xd] = '\0';
    if ((declNdx._3_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      uname.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bindNdx,"colors",(allocator<char> *)(uname.field_2._M_local_buf + 0xf));
      uname.field_2._M_local_buf[0xd] = '\x01';
      getUniformName(&local_358,(string *)&bindNdx,local_318);
    }
    else {
      std::allocator<char>::allocator();
      local_37a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"colors",&local_379);
      local_37b = 1;
      getUniformName(&local_358,&local_378,local_318,
                     (this->super_LayoutBindingRenderCase).m_numBindings);
    }
    poVar3 = std::operator<<(poVar3,(string *)&local_358);
    std::operator<<(poVar3,";\n");
    std::__cxx11::string::~string((string *)&local_358);
    if ((uname.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&bindNdx);
    }
    if ((uname.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(uname.field_2._M_local_buf + 0xf));
    }
    if ((local_37b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_378);
    }
    if ((local_37a & 1) != 0) {
      std::allocator<char>::~allocator(&local_379);
    }
    std::__cxx11::string::~string((string *)&local_338);
  }
  for (uname.field_2._8_4_ = 0; iVar1 = (this->super_LayoutBindingRenderCase).m_numBindings,
      SBORROW4(uname.field_2._8_4_,iVar1 * 2) != uname.field_2._8_4_ + iVar1 * -2 < 0;
      uname.field_2._8_4_ = uname.field_2._8_4_ + 1) {
    local_3ea = 0;
    local_3eb = 0;
    local_412 = 0;
    local_413 = 0;
    if ((declNdx._3_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      local_412 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"colors",&local_411);
      local_413 = 1;
      getUniformName((string *)local_3c8,&local_410,(int)uname.field_2._8_4_ / 2);
    }
    else {
      std::allocator<char>::allocator();
      local_3ea = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"colors",&local_3e9);
      local_3eb = 1;
      getUniformName((string *)local_3c8,&local_3e8,0,(int)uname.field_2._8_4_ / 2);
    }
    if ((local_413 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_410);
    }
    if ((local_412 & 1) != 0) {
      std::allocator<char>::~allocator(&local_411);
    }
    if ((local_3eb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_3e8);
    }
    if ((local_3ea & 1) != 0) {
      std::allocator<char>::~allocator(&local_3e9);
    }
    poVar3 = std::operator<<((ostream *)local_300,"\t");
    pcVar6 = "else if";
    if (uname.field_2._8_4_ == 0) {
      pcVar6 = "if";
    }
    poVar3 = std::operator<<(poVar3,pcVar6);
    poVar3 = std::operator<<(poVar3," (u_arrayNdx == ");
    de::toString<int>(&local_438,(int *)(uname.field_2._M_local_buf + 8));
    poVar3 = std::operator<<(poVar3,(string *)&local_438);
    poVar3 = std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(poVar3,"\t{\n");
    poVar3 = std::operator<<(poVar3,"\t\tcolor = ");
    poVar3 = std::operator<<(poVar3,(string *)local_3c8);
    if ((int)uname.field_2._8_4_ % 2 == 0) {
      local_6e8 = ".color1";
    }
    else {
      local_6e8 = ".color2";
    }
    poVar3 = std::operator<<(poVar3,local_6e8);
    poVar3 = std::operator<<(poVar3,";\n");
    std::operator<<(poVar3,"\t}\n");
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)local_3c8);
  }
  poVar3 = std::operator<<((ostream *)local_300,"\telse\n");
  poVar3 = std::operator<<(poVar3,"\t{\n");
  poVar3 = std::operator<<(poVar3,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar3,"\t}\n");
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = Context::getRenderContext
                        ((this->super_LayoutBindingRenderCase).super_TestCase.m_context);
  glu::ProgramSources::ProgramSources(&local_508);
  SVar2 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateVertexShader(&local_550,SVar2,&local_570,&local_590);
  glu::VertexSource::VertexSource((VertexSource *)&local_530,&local_550);
  pPVar5 = glu::ProgramSources::operator<<(&local_508,&local_530);
  SVar2 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateFragmentShader(&local_5d8,SVar2,&local_5f8,&local_618);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_5b8,&local_5d8);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,&local_5b8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar5);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::string::~string((string *)&local_5f8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  glu::ProgramSources::~ProgramSources(&local_508);
  std::__cxx11::ostringstream::~ostringstream(local_300);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return this_00;
}

Assistant:

glu::ShaderProgram* SSBOBindingRenderCase::generateShaders (void) const
{
	std::ostringstream		shaderUniformDecl;
	std::ostringstream		shaderBody;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		shaderUniformDecl << "layout(std140, binding = " << m_bindings[declNdx] << ") buffer "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings*2; ++bindNdx)	// Multiply by two to cover cases for both colors for each UBO
	{
		const std::string uname = (arrayInstance ? getUniformName("colors", 0, bindNdx/2) : getUniformName("colors", bindNdx/2));
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = " << uname << (bindNdx%2 == 0 ? ".color1" : ".color2") << ";\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource(generateVertexShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str()))
					<< glu::FragmentSource(generateFragmentShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str())));
}